

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O3

bool __thiscall
Ruleset::containsType(Ruleset *this,vector<Card,_std::allocator<Card>_> *cards,Card *card)

{
  pointer ppRVar1;
  pointer pCVar2;
  bool bVar3;
  uint uVar4;
  Suit SVar5;
  Suit SVar6;
  pointer ppRVar7;
  pointer pCVar8;
  Card c;
  Card local_38;
  
  ppRVar7 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar1 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppRVar7 != ppRVar1) {
    uVar4 = 0;
    do {
      uVar4 = (**(*ppRVar7)->_vptr_Rule)(*ppRVar7,(ulong)(uVar4 & 1),card);
      ppRVar7 = ppRVar7 + 1;
    } while (ppRVar7 != ppRVar1);
    if ((char)uVar4 != '\0') {
      bVar3 = containsTrump(this,cards);
      return bVar3;
    }
  }
  pCVar8 = (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pCVar2 = (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pCVar8 != pCVar2) {
    do {
      local_38 = *pCVar8;
      ppRVar7 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppRVar1 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppRVar7 == ppRVar1) {
LAB_00106ebf:
        SVar5 = Card::suit(&local_38);
        SVar6 = Card::suit(card);
        if (SVar5 == SVar6) {
          return true;
        }
      }
      else {
        uVar4 = 0;
        do {
          uVar4 = (**(*ppRVar7)->_vptr_Rule)(*ppRVar7,(ulong)(uVar4 & 1),&local_38);
          ppRVar7 = ppRVar7 + 1;
        } while (ppRVar7 != ppRVar1);
        if ((char)uVar4 == '\0') goto LAB_00106ebf;
      }
      pCVar8 = pCVar8 + 1;
    } while (pCVar8 != pCVar2);
  }
  return false;
}

Assistant:

bool Ruleset::containsType(const std::vector<Card> &cards, const Card &card) {
    if (isTrump(card))
        return containsTrump(cards);
    for (Card c: cards)
        if (!isTrump(c) && c.suit() == card.suit())
            return true;
    return false;
}